

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.c
# Opt level: O0

void av1_setup_scale_factors_for_frame
               (scale_factors *sf,int other_w,int other_h,int this_w,int this_h)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  
  iVar1 = valid_ref_frame_size(in_ESI,in_EDX,in_ECX,in_R8D);
  if (iVar1 == 0) {
    *in_RDI = -1;
    in_RDI[1] = -1;
  }
  else {
    iVar1 = get_fixed_point_scale_factor(in_ESI,in_ECX);
    *in_RDI = iVar1;
    iVar1 = get_fixed_point_scale_factor(in_EDX,in_R8D);
    in_RDI[1] = iVar1;
    iVar1 = fixed_point_scale_to_coarse_point_scale(*in_RDI);
    in_RDI[2] = iVar1;
    iVar1 = fixed_point_scale_to_coarse_point_scale(in_RDI[1]);
    in_RDI[3] = iVar1;
  }
  return;
}

Assistant:

void av1_setup_scale_factors_for_frame(struct scale_factors *sf, int other_w,
                                       int other_h, int this_w, int this_h) {
  if (!valid_ref_frame_size(other_w, other_h, this_w, this_h)) {
    sf->x_scale_fp = REF_INVALID_SCALE;
    sf->y_scale_fp = REF_INVALID_SCALE;
    return;
  }

  sf->x_scale_fp = get_fixed_point_scale_factor(other_w, this_w);
  sf->y_scale_fp = get_fixed_point_scale_factor(other_h, this_h);

  sf->x_step_q4 = fixed_point_scale_to_coarse_point_scale(sf->x_scale_fp);
  sf->y_step_q4 = fixed_point_scale_to_coarse_point_scale(sf->y_scale_fp);
}